

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueBase.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsTorqueBase::ArchiveOUT(ChShaftsTorqueBase *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsTorqueBase>(marchive);
  ChShaftsCouple::ArchiveOUT(&this->super_ChShaftsCouple,marchive);
  local_28._value = &this->torque;
  local_28._name = "torque";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChShaftsTorqueBase::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsTorqueBase>();

    // serialize parent class
    ChShaftsCouple::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(torque);
}